

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VertexClustering::computeClusters(VertexClustering *this,bool constrain)

{
  _Elt_pointer pVVar1;
  VertexClustering *pVVar2;
  bool bVar3;
  iterator iVar4;
  clock_t cVar5;
  ulong uVar6;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *this_00;
  uint uVar7;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *pqVar8;
  VCEdge e;
  set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> tested;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> boundary_next;
  key_type local_e8;
  VertexClustering *local_d0;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *local_c8;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *local_c0;
  clock_t local_b8;
  _Rb_tree<VCEdge,VCEdge,std::_Identity<VCEdge>,VCEdgeItemCmp,std::allocator<VCEdge>> local_b0 [8];
  _Rb_tree_node_base local_a8;
  undefined8 local_88;
  _Deque_base<VCEdge,_std::allocator<VCEdge>_> local_80;
  
  std::queue<VCEdge,std::deque<VCEdge,std::allocator<VCEdge>>>::
  queue<std::deque<VCEdge,std::allocator<VCEdge>>,void>
            ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)&local_80);
  local_b8 = clock();
  totalEnergy(this);
  local_d0 = this;
  printf("---start clustering, with total energy: %.12lf---\n");
  uVar7 = 0;
  local_c8 = &this->boundary;
  pqVar8 = (queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)&local_80;
  local_c0 = &this->boundary;
  do {
    this_00 = local_c8;
    pVVar2 = local_d0;
    local_a8._M_color = _S_red;
    local_a8._M_parent = (_Base_ptr)0x0;
    local_a8._M_left = &local_a8;
    local_88 = 0;
    uVar6 = 0;
    local_c8 = pqVar8;
    local_a8._M_right = local_a8._M_left;
    while( true ) {
      pVVar1 = (this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if ((this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur == pVVar1) break;
      local_e8.f1 = pVVar1->f1;
      local_e8.f2 = pVVar1->f2;
      std::deque<VCEdge,_std::allocator<VCEdge>_>::pop_front(&this_00->c);
      if (((local_e8.f2 != (VCFace *)0x0) && (local_e8.f1 != (VCFace *)0x0)) &&
         ((local_e8.f1)->cluster != (local_e8.f2)->cluster)) {
        iVar4 = std::
                _Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>
                ::find((_Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>
                        *)local_b0,&local_e8);
        if (iVar4._M_node == &local_a8) {
          std::_Rb_tree<VCEdge,VCEdge,std::_Identity<VCEdge>,VCEdgeItemCmp,std::allocator<VCEdge>>::
          _M_insert_unique<VCEdge_const&>(local_b0,&local_e8);
          bVar3 = localEnergyRelease(pVVar2,(local_e8.f1)->cluster,(local_e8.f2)->cluster,&local_e8,
                                     local_c8,constrain);
          uVar6 = (ulong)((int)uVar6 + (uint)bVar3);
        }
      }
    }
    uVar7 = uVar7 + 1;
    printf("iteration: %d, modification: %d, ",(ulong)uVar7,uVar6);
    totalEnergy(pVVar2);
    printf("total energy: %.12lf\n");
    std::_Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::
    ~_Rb_tree((_Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>
               *)local_b0);
    pVVar2 = local_d0;
    pqVar8 = this_00;
  } while (0 < (int)uVar6);
  if ((local_d0->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (local_d0->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::deque<VCEdge,_std::allocator<VCEdge>_>::operator=
              (&local_c0->c,(deque<VCEdge,_std::allocator<VCEdge>_> *)&local_80);
  }
  cVar5 = clock();
  printf("Done, uses %lf s for clustering.\n",(double)(cVar5 - local_b8) / 1000000.0);
  totalEnergy(pVVar2);
  printf("---total energy: %.12lf---\n");
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

void VertexClustering::computeClusters(bool constrain)
{
	queue<VCEdge> boundary_next;
	queue<VCEdge> *q1 = &boundary, *q2 = &boundary_next;
	int modification;
	int iteration = 0;
	clock_t start = clock();
	printf("---start clustering, with total energy: %.12lf---\n", totalEnergy());
	do {
		modification = 0;
		set<VCEdge, VCEdgeItemCmp> tested;
		while (!q1->empty()) {
			VCEdge e = q1->front();
			q1->pop();
			if (e.isBoundary() && tested.find(e) == tested.end()) {
				tested.insert(e);
				VCCluster *c1 = e.f1->cluster;
				VCCluster *c2 = e.f2->cluster;
				if (localEnergyRelease(c1, c2, e, q2, constrain)) {
					modification++;
				}
			}
		}
		printf("iteration: %d, modification: %d, ", ++iteration, modification);
		printf("total energy: %.12lf\n", totalEnergy());
		std::swap(q1, q2);
	} while (modification > 0);
	if (boundary.empty())
		boundary = boundary_next;

	printf("Done, uses %lf s for clustering.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
	printf("---total energy: %.12lf---\n", totalEnergy());
}